

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.h
# Opt level: O0

void WriteWaveFormatExtensible
               (FAudioWaveFormatExtensible *fmt,int channels,int samplerate,FAudioGUID *subformat)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined2 in_SI;
  undefined2 *in_RDI;
  SDL_AssertState sdl_assert_state;
  
  do {
    if (in_RDI != (undefined2 *)0x0) goto LAB_00135cc3;
    iVar2 = SDL_ReportAssertion(&WriteWaveFormatExtensible::sdl_assert_data,
                                "WriteWaveFormatExtensible",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_internal.h"
                                ,0x32b);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_00135cc3:
  in_RDI[7] = 0x20;
  *in_RDI = 0xfffe;
  in_RDI[1] = in_SI;
  *(undefined4 *)(in_RDI + 2) = in_EDX;
  in_RDI[6] = in_RDI[1] * ((ushort)in_RDI[7] / 8);
  *(uint *)(in_RDI + 4) = *(int *)(in_RDI + 2) * (uint)(ushort)in_RDI[6];
  in_RDI[8] = 0x16;
  in_RDI[9] = 0x20;
  uVar3 = GetMask(0);
  *(uint32_t *)(in_RDI + 10) = uVar3;
  SDL_memcpy(in_RDI + 0xc,in_RCX,0x10);
  return;
}

Assistant:

static inline void WriteWaveFormatExtensible(
	FAudioWaveFormatExtensible *fmt,
	int channels,
	int samplerate,
	const FAudioGUID *subformat
) {
	FAudio_assert(fmt != NULL);
	fmt->Format.wBitsPerSample = 32;
	fmt->Format.wFormatTag = FAUDIO_FORMAT_EXTENSIBLE;
	fmt->Format.nChannels = channels;
	fmt->Format.nSamplesPerSec = samplerate;
	fmt->Format.nBlockAlign = (
		fmt->Format.nChannels *
		(fmt->Format.wBitsPerSample / 8)
	);
	fmt->Format.nAvgBytesPerSec = (
		fmt->Format.nSamplesPerSec *
		fmt->Format.nBlockAlign
	);
	fmt->Format.cbSize = sizeof(FAudioWaveFormatExtensible) - sizeof(FAudioWaveFormatEx);
	fmt->Samples.wValidBitsPerSample = 32;
	fmt->dwChannelMask = GetMask(fmt->Format.nChannels);
	FAudio_memcpy(&fmt->SubFormat, subformat, sizeof(FAudioGUID));
}